

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_flow_scalar(yaml_parser_t *parser,yaml_token_t *token,int single)

{
  yaml_mark_t *pyVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  yaml_mark_t context_mark;
  yaml_mark_t context_mark_00;
  yaml_mark_t context_mark_01;
  yaml_mark_t context_mark_02;
  yaml_mark_t context_mark_03;
  bool bVar7;
  byte bVar8;
  int iVar9;
  yaml_char_t yVar10;
  yaml_scalar_style_t yVar11;
  yaml_char_t *pyVar12;
  yaml_char_t *pyVar13;
  bool bVar14;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_180;
  int local_17c;
  int local_178;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  size_t k;
  ulong uStack_c8;
  uint value;
  size_t code_length;
  yaml_char_t *pyStack_b8;
  int leading_blanks;
  yaml_string_t whitespaces;
  yaml_string_t trailing_breaks;
  yaml_string_t leading_break;
  yaml_string_t string;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  int single_local;
  yaml_token_t *token_local;
  yaml_parser_t *parser_local;
  
  memset(&leading_break.pointer,0,0x18);
  memset(&trailing_breaks.pointer,0,0x18);
  memset(&whitespaces.pointer,0,0x18);
  memset(&stack0xffffffffffffff48,0,0x18);
  leading_break.pointer = (yaml_char_t *)yaml_malloc(0x10);
  if (leading_break.pointer == (yaml_char_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = leading_break.pointer + 0x10;
    string.end = leading_break.pointer;
    memset(leading_break.pointer,0,0x10);
    trailing_breaks.pointer = (yaml_char_t *)yaml_malloc(0x10);
    if (trailing_breaks.pointer == (yaml_char_t *)0x0) {
      parser->error = YAML_MEMORY_ERROR;
    }
    else {
      leading_break.start = trailing_breaks.pointer + 0x10;
      leading_break.end = trailing_breaks.pointer;
      memset(trailing_breaks.pointer,0,0x10);
      whitespaces.pointer = (yaml_char_t *)yaml_malloc(0x10);
      if (whitespaces.pointer == (yaml_char_t *)0x0) {
        parser->error = YAML_MEMORY_ERROR;
      }
      else {
        trailing_breaks.start = whitespaces.pointer + 0x10;
        trailing_breaks.end = whitespaces.pointer;
        memset(whitespaces.pointer,0,0x10);
        pyStack_b8 = (yaml_char_t *)yaml_malloc(0x10);
        if (pyStack_b8 != (yaml_char_t *)0x0) {
          whitespaces.start = pyStack_b8 + 0x10;
          whitespaces.end = pyStack_b8;
          memset(pyStack_b8,0,0x10);
          pyVar1 = &parser->mark;
          sVar2 = pyVar1->index;
          sVar3 = (parser->mark).line;
          sVar4 = (parser->mark).column;
          context_mark_03 = *pyVar1;
          context_mark_02 = *pyVar1;
          context_mark_01 = *pyVar1;
          context_mark_00 = *pyVar1;
          context_mark = *pyVar1;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = (parser->mark).column + 1;
          parser->unread = parser->unread - 1;
          if ((*(parser->buffer).pointer & 0x80) == 0) {
            local_dc = 1;
          }
          else {
            if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
              local_e0 = 2;
            }
            else {
              if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                local_e4 = 3;
              }
              else {
                local_e4 = 0;
                if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                  local_e4 = 4;
                }
              }
              local_e0 = local_e4;
            }
            local_dc = local_e0;
          }
          (parser->buffer).pointer = (parser->buffer).pointer + local_dc;
LAB_00112b71:
          if ((3 < parser->unread) || (iVar9 = yaml_parser_update_buffer(parser,4), iVar9 != 0)) {
            if ((((parser->mark).column == 0) &&
                ((((*(parser->buffer).pointer == '-' && ((parser->buffer).pointer[1] == '-')) &&
                  ((parser->buffer).pointer[2] == '-')) ||
                 (((*(parser->buffer).pointer == '.' && ((parser->buffer).pointer[1] == '.')) &&
                  ((parser->buffer).pointer[2] == '.')))))) &&
               (((((((parser->buffer).pointer[3] == ' ' || ((parser->buffer).pointer[3] == '\t')) ||
                   (((parser->buffer).pointer[3] == '\r' || ((parser->buffer).pointer[3] == '\n'))))
                  || (((parser->buffer).pointer[3] == 0xc2 && ((parser->buffer).pointer[4] == 0x85))
                     )) || (((parser->buffer).pointer[3] == 0xe2 &&
                            (((parser->buffer).pointer[4] == 0x80 &&
                             ((parser->buffer).pointer[5] == 0xa8)))))) ||
                ((((parser->buffer).pointer[3] == 0xe2 &&
                  (((parser->buffer).pointer[4] == 0x80 && ((parser->buffer).pointer[5] == 0xa9))))
                 || ((parser->buffer).pointer[3] == '\0')))))) {
              yaml_parser_set_scanner_error
                        (parser,"while scanning a quoted scalar",context_mark,
                         "found unexpected document indicator");
            }
            else if (*(parser->buffer).pointer == '\0') {
              yaml_parser_set_scanner_error
                        (parser,"while scanning a quoted scalar",context_mark_00,
                         "found unexpected end of stream");
            }
            else if ((1 < parser->unread) ||
                    (iVar9 = yaml_parser_update_buffer(parser,2), iVar9 != 0)) {
              bVar7 = false;
              do {
                bVar14 = true;
                if (((((((*(parser->buffer).pointer != ' ') &&
                        (bVar14 = true, *(parser->buffer).pointer != '\t')) &&
                       (bVar14 = true, *(parser->buffer).pointer != '\r')) &&
                      (bVar14 = true, *(parser->buffer).pointer != '\n')) &&
                     ((*(parser->buffer).pointer != 0xc2 ||
                      (bVar14 = true, (parser->buffer).pointer[1] != 0x85)))) &&
                    ((*(parser->buffer).pointer != 0xe2 ||
                     (((parser->buffer).pointer[1] != 0x80 ||
                      (bVar14 = true, (parser->buffer).pointer[2] != 0xa8)))))) &&
                   ((*(parser->buffer).pointer != 0xe2 ||
                    (((parser->buffer).pointer[1] != 0x80 ||
                     (bVar14 = true, (parser->buffer).pointer[2] != 0xa9)))))) {
                  bVar14 = *(parser->buffer).pointer == '\0';
                }
                if (bVar14) goto LAB_001145db;
                if (((single == 0) || (*(parser->buffer).pointer != '\'')) ||
                   ((parser->buffer).pointer[1] != '\'')) {
                  yVar10 = '\"';
                  if (single != 0) {
                    yVar10 = '\'';
                  }
                  if (*(parser->buffer).pointer == yVar10) goto LAB_001145db;
                  if (((single == 0) && (*(parser->buffer).pointer == '\\')) &&
                     (((((parser->buffer).pointer[1] == '\r' ||
                        ((parser->buffer).pointer[1] == '\n')) ||
                       ((((parser->buffer).pointer[1] == 0xc2 &&
                         ((parser->buffer).pointer[2] == 0x85)) ||
                        (((parser->buffer).pointer[1] == 0xe2 &&
                         (((parser->buffer).pointer[2] == 0x80 &&
                          ((parser->buffer).pointer[3] == 0xa8)))))))) ||
                      (((parser->buffer).pointer[1] == 0xe2 &&
                       (((parser->buffer).pointer[2] == 0x80 &&
                        ((parser->buffer).pointer[3] == 0xa9)))))))) goto LAB_0011339e;
                  if ((single == 0) && (*(parser->buffer).pointer == '\\')) {
                    uStack_c8 = 0;
                    if ((string.start <= string.end + 5) &&
                       (iVar9 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start)
                       , iVar9 == 0)) {
                      parser->error = YAML_MEMORY_ERROR;
                      break;
                    }
                    switch((parser->buffer).pointer[1]) {
                    case '\t':
                    case 't':
                      *string.end = '\t';
                      string.end = string.end + 1;
                      break;
                    default:
                      yaml_parser_set_scanner_error
                                (parser,"while parsing a quoted scalar",context_mark_01,
                                 "found unknown escape character");
                      goto LAB_00115a96;
                    case ' ':
                      *string.end = ' ';
                      string.end = string.end + 1;
                      break;
                    case '\"':
                      *string.end = '\"';
                      string.end = string.end + 1;
                      break;
                    case '/':
                      *string.end = '/';
                      string.end = string.end + 1;
                      break;
                    case '0':
                      *string.end = '\0';
                      string.end = string.end + 1;
                      break;
                    case 'L':
                      *string.end = 0xe2;
                      string.end[1] = 0x80;
                      string.end[2] = 0xa8;
                      string.end = string.end + 3;
                      break;
                    case 'N':
                      *string.end = 0xc2;
                      string.end[1] = 0x85;
                      string.end = string.end + 2;
                      break;
                    case 'P':
                      *string.end = 0xe2;
                      string.end[1] = 0x80;
                      string.end[2] = 0xa9;
                      string.end = string.end + 3;
                      break;
                    case 'U':
                      uStack_c8 = 8;
                      break;
                    case '\\':
                      *string.end = '\\';
                      string.end = string.end + 1;
                      break;
                    case '_':
                      *string.end = 0xc2;
                      string.end[1] = 0xa0;
                      string.end = string.end + 2;
                      break;
                    case 'a':
                      *string.end = '\a';
                      string.end = string.end + 1;
                      break;
                    case 'b':
                      *string.end = '\b';
                      string.end = string.end + 1;
                      break;
                    case 'e':
                      *string.end = '\x1b';
                      string.end = string.end + 1;
                      break;
                    case 'f':
                      *string.end = '\f';
                      string.end = string.end + 1;
                      break;
                    case 'n':
                      *string.end = '\n';
                      string.end = string.end + 1;
                      break;
                    case 'r':
                      *string.end = '\r';
                      string.end = string.end + 1;
                      break;
                    case 'u':
                      uStack_c8 = 4;
                      break;
                    case 'v':
                      *string.end = '\v';
                      string.end = string.end + 1;
                      break;
                    case 'x':
                      uStack_c8 = 2;
                    }
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = (parser->mark).column + 1;
                    parser->unread = parser->unread - 1;
                    if ((*(parser->buffer).pointer & 0x80) == 0) {
                      local_12c = 1;
                    }
                    else {
                      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                        local_130 = 2;
                      }
                      else {
                        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                          local_134 = 3;
                        }
                        else {
                          local_134 = 0;
                          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                            local_134 = 4;
                          }
                        }
                        local_130 = local_134;
                      }
                      local_12c = local_130;
                    }
                    (parser->buffer).pointer = (parser->buffer).pointer + local_12c;
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = (parser->mark).column + 1;
                    parser->unread = parser->unread - 1;
                    if ((*(parser->buffer).pointer & 0x80) == 0) {
                      local_138 = 1;
                    }
                    else {
                      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                        local_13c = 2;
                      }
                      else {
                        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                          local_140 = 3;
                        }
                        else {
                          local_140 = 0;
                          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                            local_140 = 4;
                          }
                        }
                        local_13c = local_140;
                      }
                      local_138 = local_13c;
                    }
                    (parser->buffer).pointer = (parser->buffer).pointer + local_138;
                    if (uStack_c8 != 0) {
                      k._4_4_ = 0;
                      if ((parser->unread < uStack_c8) &&
                         (iVar9 = yaml_parser_update_buffer(parser,uStack_c8), iVar9 == 0)) break;
                      for (local_d8 = 0; local_d8 < uStack_c8; local_d8 = local_d8 + 1) {
                        if (((((parser->buffer).pointer[local_d8] < 0x30) ||
                             (0x39 < (parser->buffer).pointer[local_d8])) &&
                            (((parser->buffer).pointer[local_d8] < 0x41 ||
                             (0x46 < (parser->buffer).pointer[local_d8])))) &&
                           (((parser->buffer).pointer[local_d8] < 0x61 ||
                            (0x66 < (parser->buffer).pointer[local_d8])))) {
                          yaml_parser_set_scanner_error
                                    (parser,"while parsing a quoted scalar",context_mark_02,
                                     "did not find expected hexdecimal number");
                          goto LAB_00115a96;
                        }
                        if (((parser->buffer).pointer[local_d8] < 0x41) ||
                           (0x46 < (parser->buffer).pointer[local_d8])) {
                          if (((parser->buffer).pointer[local_d8] < 0x61) ||
                             (0x66 < (parser->buffer).pointer[local_d8])) {
                            local_14c = (parser->buffer).pointer[local_d8] - 0x30;
                          }
                          else {
                            local_14c = (parser->buffer).pointer[local_d8] - 0x57;
                          }
                          local_148 = local_14c;
                        }
                        else {
                          local_148 = (parser->buffer).pointer[local_d8] - 0x37;
                        }
                        k._4_4_ = k._4_4_ * 0x10 + local_148;
                      }
                      if (((0xd7ff < k._4_4_) && (k._4_4_ < 0xe000)) || (0x10ffff < k._4_4_)) {
                        yaml_parser_set_scanner_error
                                  (parser,"while parsing a quoted scalar",context_mark_03,
                                   "found invalid Unicode character escape code");
                        break;
                      }
                      bVar8 = (byte)k._4_4_;
                      if (k._4_4_ < 0x80) {
                        *string.end = bVar8;
                        string.end = string.end + 1;
                      }
                      else if (k._4_4_ < 0x800) {
                        pyVar12 = string.end + 1;
                        *string.end = (char)(k._4_4_ >> 6) + 0xc0;
                        string.end = string.end + 2;
                        *pyVar12 = (bVar8 & 0x3f) + 0x80;
                      }
                      else if (k._4_4_ < 0x10000) {
                        *string.end = (char)(k._4_4_ >> 0xc) + 0xe0;
                        pyVar12 = string.end + 2;
                        string.end[1] = ((byte)(k._4_4_ >> 6) & 0x3f) + 0x80;
                        string.end = string.end + 3;
                        *pyVar12 = (bVar8 & 0x3f) + 0x80;
                      }
                      else {
                        *string.end = (char)(k._4_4_ >> 0x12) + 0xf0;
                        string.end[1] = ((byte)(k._4_4_ >> 0xc) & 0x3f) + 0x80;
                        pyVar12 = string.end + 3;
                        string.end[2] = ((byte)(k._4_4_ >> 6) & 0x3f) + 0x80;
                        string.end = string.end + 4;
                        *pyVar12 = (bVar8 & 0x3f) + 0x80;
                      }
                      for (local_d8 = 0; local_d8 < uStack_c8; local_d8 = local_d8 + 1) {
                        (parser->mark).index = (parser->mark).index + 1;
                        (parser->mark).column = (parser->mark).column + 1;
                        parser->unread = parser->unread - 1;
                        if ((*(parser->buffer).pointer & 0x80) == 0) {
                          local_150 = 1;
                        }
                        else {
                          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                            local_154 = 2;
                          }
                          else {
                            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                              local_158 = 3;
                            }
                            else {
                              local_158 = 0;
                              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                                local_158 = 4;
                              }
                            }
                            local_154 = local_158;
                          }
                          local_150 = local_154;
                        }
                        (parser->buffer).pointer = (parser->buffer).pointer + local_150;
                      }
                    }
                  }
                  else {
                    if ((string.start <= string.end + 5) &&
                       (iVar9 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start)
                       , iVar9 == 0)) {
                      parser->error = YAML_MEMORY_ERROR;
                      break;
                    }
                    if ((*(parser->buffer).pointer & 0x80) == 0) {
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      *string.end = *pyVar12;
                      string.end = string.end + 1;
                    }
                    else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      pyVar13 = string.end + 1;
                      *string.end = *pyVar12;
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      string.end = string.end + 2;
                      *pyVar13 = *pyVar12;
                    }
                    else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      *string.end = *pyVar12;
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      pyVar13 = string.end + 2;
                      string.end[1] = *pyVar12;
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      string.end = string.end + 3;
                      *pyVar13 = *pyVar12;
                    }
                    else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      *string.end = *pyVar12;
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      string.end[1] = *pyVar12;
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      pyVar13 = string.end + 3;
                      string.end[2] = *pyVar12;
                      pyVar12 = (parser->buffer).pointer;
                      (parser->buffer).pointer = pyVar12 + 1;
                      string.end = string.end + 4;
                      *pyVar13 = *pyVar12;
                    }
                    (parser->mark).index = (parser->mark).index + 1;
                    (parser->mark).column = (parser->mark).column + 1;
                    parser->unread = parser->unread - 1;
                  }
                }
                else {
                  if ((string.start <= string.end + 5) &&
                     (iVar9 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start),
                     iVar9 == 0)) {
                    parser->error = YAML_MEMORY_ERROR;
                    break;
                  }
                  *string.end = '\'';
                  (parser->mark).index = (parser->mark).index + 1;
                  (parser->mark).column = (parser->mark).column + 1;
                  parser->unread = parser->unread - 1;
                  if ((*(parser->buffer).pointer & 0x80) == 0) {
                    local_ec = 1;
                  }
                  else {
                    if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                      local_f0 = 2;
                    }
                    else {
                      if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                        local_f4 = 3;
                      }
                      else {
                        local_f4 = 0;
                        if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                          local_f4 = 4;
                        }
                      }
                      local_f0 = local_f4;
                    }
                    local_ec = local_f0;
                  }
                  (parser->buffer).pointer = (parser->buffer).pointer + local_ec;
                  (parser->mark).index = (parser->mark).index + 1;
                  (parser->mark).column = (parser->mark).column + 1;
                  parser->unread = parser->unread - 1;
                  if ((*(parser->buffer).pointer & 0x80) == 0) {
                    local_f8 = 1;
                  }
                  else {
                    if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                      local_fc = 2;
                    }
                    else {
                      if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                        local_100 = 3;
                      }
                      else {
                        local_100 = 0;
                        if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                          local_100 = 4;
                        }
                      }
                      local_fc = local_100;
                    }
                    local_f8 = local_fc;
                  }
                  (parser->buffer).pointer = (parser->buffer).pointer + local_f8;
                  string.end = string.end + 1;
                }
                if ((parser->unread < 2) &&
                   (iVar9 = yaml_parser_update_buffer(parser,2), iVar9 == 0)) break;
              } while( true );
            }
          }
          goto LAB_00115a96;
        }
        parser->error = YAML_MEMORY_ERROR;
      }
    }
  }
LAB_00115a96:
  yaml_free(leading_break.pointer);
  string.start = (yaml_char_t *)0x0;
  string.end = (yaml_char_t *)0x0;
  leading_break.pointer = (yaml_char_t *)0x0;
  yaml_free(trailing_breaks.pointer);
  leading_break.start = (yaml_char_t *)0x0;
  leading_break.end = (yaml_char_t *)0x0;
  trailing_breaks.pointer = (yaml_char_t *)0x0;
  yaml_free(whitespaces.pointer);
  trailing_breaks.start = (yaml_char_t *)0x0;
  trailing_breaks.end = (yaml_char_t *)0x0;
  whitespaces.pointer = (yaml_char_t *)0x0;
  yaml_free(pyStack_b8);
  return 0;
LAB_0011339e:
  if ((parser->unread < 3) && (iVar9 = yaml_parser_update_buffer(parser,3), iVar9 == 0))
  goto LAB_00115a96;
  (parser->mark).index = (parser->mark).index + 1;
  (parser->mark).column = (parser->mark).column + 1;
  parser->unread = parser->unread - 1;
  if ((*(parser->buffer).pointer & 0x80) == 0) {
    local_104 = 1;
  }
  else {
    if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
      local_108 = 2;
    }
    else {
      if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
        local_10c = 3;
      }
      else {
        local_10c = 0;
        if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
          local_10c = 4;
        }
      }
      local_108 = local_10c;
    }
    local_104 = local_108;
  }
  (parser->buffer).pointer = (parser->buffer).pointer + local_104;
  if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
    (parser->mark).index = (parser->mark).index + 2;
    (parser->mark).column = 0;
    (parser->mark).line = (parser->mark).line + 1;
    parser->unread = parser->unread - 2;
    (parser->buffer).pointer = (parser->buffer).pointer + 2;
  }
  else if (((((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) ||
            ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85)))) ||
           ((*(parser->buffer).pointer == 0xe2 &&
            (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa8)))))) ||
          ((*(parser->buffer).pointer == 0xe2 &&
           (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa9)))))) {
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = 0;
    (parser->mark).line = (parser->mark).line + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_110 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_114 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_118 = 3;
        }
        else {
          local_118 = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_118 = 4;
          }
        }
        local_114 = local_118;
      }
      local_110 = local_114;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_110;
  }
  bVar7 = true;
LAB_001145db:
  if ((parser->unread == 0) && (iVar9 = yaml_parser_update_buffer(parser,1), iVar9 == 0))
  goto LAB_00115a96;
  yVar10 = '\"';
  if (single != 0) {
    yVar10 = '\'';
  }
  if (*(parser->buffer).pointer == yVar10) {
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).column = (parser->mark).column + 1;
    parser->unread = parser->unread - 1;
    if ((*(parser->buffer).pointer & 0x80) == 0) {
      local_1b4 = 1;
    }
    else {
      if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
        local_1b8 = 2;
      }
      else {
        if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          local_1bc = 3;
        }
        else {
          local_1bc = 0;
          if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            local_1bc = 4;
          }
        }
        local_1b8 = local_1bc;
      }
      local_1b4 = local_1b8;
    }
    (parser->buffer).pointer = (parser->buffer).pointer + local_1b4;
    string.pointer = (yaml_char_t *)(parser->mark).index;
    sVar5 = (parser->mark).line;
    sVar6 = (parser->mark).column;
    memset(token,0,0x50);
    token->type = YAML_SCALAR_TOKEN;
    (token->start_mark).index = sVar2;
    (token->start_mark).line = sVar3;
    (token->start_mark).column = sVar4;
    (token->end_mark).index = (size_t)string.pointer;
    (token->end_mark).line = sVar5;
    (token->end_mark).column = sVar6;
    (token->data).tag.handle = leading_break.pointer;
    (token->data).tag.suffix = string.end + -(long)leading_break.pointer;
    yVar11 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    if (single != 0) {
      yVar11 = YAML_SINGLE_QUOTED_SCALAR_STYLE;
    }
    (token->data).scalar.style = yVar11;
    yaml_free(trailing_breaks.pointer);
    leading_break.start = (yaml_char_t *)0x0;
    leading_break.end = (yaml_char_t *)0x0;
    trailing_breaks.pointer = (yaml_char_t *)0x0;
    yaml_free(whitespaces.pointer);
    trailing_breaks.start = (yaml_char_t *)0x0;
    trailing_breaks.end = (yaml_char_t *)0x0;
    whitespaces.pointer = (yaml_char_t *)0x0;
    yaml_free(pyStack_b8);
    return 1;
  }
  if (parser->unread == 0) {
    iVar9 = yaml_parser_update_buffer(parser,1);
    goto joined_r0x0011465d;
  }
  while( true ) {
    bVar14 = true;
    if ((((((*(parser->buffer).pointer != ' ') && (bVar14 = true, *(parser->buffer).pointer != '\t')
           ) && (bVar14 = true, *(parser->buffer).pointer != '\r')) &&
         ((bVar14 = true, *(parser->buffer).pointer != '\n' &&
          ((*(parser->buffer).pointer != 0xc2 ||
           (bVar14 = true, (parser->buffer).pointer[1] != 0x85)))))) &&
        ((*(parser->buffer).pointer != 0xe2 ||
         (((parser->buffer).pointer[1] != 0x80 ||
          (bVar14 = true, (parser->buffer).pointer[2] != 0xa8)))))) &&
       ((bVar14 = false, *(parser->buffer).pointer == 0xe2 &&
        (bVar14 = false, (parser->buffer).pointer[1] == 0x80)))) {
      bVar14 = (parser->buffer).pointer[2] == 0xa9;
    }
    if (!bVar14) break;
    if ((*(parser->buffer).pointer == ' ') || (*(parser->buffer).pointer == '\t')) {
      if (bVar7) {
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          local_178 = 1;
        }
        else {
          if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            local_17c = 2;
          }
          else {
            if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
              local_180 = 3;
            }
            else {
              local_180 = 0;
              if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                local_180 = 4;
              }
            }
            local_17c = local_180;
          }
          local_178 = local_17c;
        }
        (parser->buffer).pointer = (parser->buffer).pointer + local_178;
      }
      else {
        if ((whitespaces.start <= whitespaces.end + 5) &&
           (iVar9 = yaml_string_extend(&stack0xffffffffffffff48,&whitespaces.end,&whitespaces.start)
           , iVar9 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_00115a96;
        }
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          *whitespaces.end = *pyVar12;
          whitespaces.end = whitespaces.end + 1;
        }
        else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          pyVar13 = whitespaces.end + 1;
          *whitespaces.end = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          whitespaces.end = whitespaces.end + 2;
          *pyVar13 = *pyVar12;
        }
        else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          *whitespaces.end = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          pyVar13 = whitespaces.end + 2;
          whitespaces.end[1] = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          whitespaces.end = whitespaces.end + 3;
          *pyVar13 = *pyVar12;
        }
        else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          *whitespaces.end = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          whitespaces.end[1] = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          pyVar13 = whitespaces.end + 3;
          whitespaces.end[2] = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          whitespaces.end = whitespaces.end + 4;
          *pyVar13 = *pyVar12;
        }
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
      }
    }
    else {
      if ((parser->unread < 2) && (iVar9 = yaml_parser_update_buffer(parser,2), iVar9 == 0))
      goto LAB_00115a96;
      if (bVar7) {
        if ((trailing_breaks.start <= trailing_breaks.end + 5) &&
           (iVar9 = yaml_string_extend(&whitespaces.pointer,&trailing_breaks.end,
                                       &trailing_breaks.start), iVar9 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_00115a96;
        }
        if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
          *trailing_breaks.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 2;
          (parser->mark).index = (parser->mark).index + 2;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 2;
          trailing_breaks.end = trailing_breaks.end + 1;
        }
        else if ((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) {
          *trailing_breaks.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 1;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
          trailing_breaks.end = trailing_breaks.end + 1;
        }
        else if ((*(parser->buffer).pointer == 0xc2) && ((parser->buffer).pointer[1] == 0x85)) {
          *trailing_breaks.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 2;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
          trailing_breaks.end = trailing_breaks.end + 1;
        }
        else if (((*(parser->buffer).pointer == 0xe2) && ((parser->buffer).pointer[1] == 0x80)) &&
                (((parser->buffer).pointer[2] == 0xa8 || ((parser->buffer).pointer[2] == 0xa9)))) {
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          *trailing_breaks.end = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          pyVar13 = trailing_breaks.end + 2;
          trailing_breaks.end[1] = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          trailing_breaks.end = trailing_breaks.end + 3;
          *pyVar13 = *pyVar12;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
        }
      }
      else {
        whitespaces.end = pyStack_b8;
        memset(pyStack_b8,0,(long)whitespaces.start - (long)pyStack_b8);
        if ((leading_break.start <= leading_break.end + 5) &&
           (iVar9 = yaml_string_extend(&trailing_breaks.pointer,&leading_break.end,
                                       &leading_break.start), iVar9 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_00115a96;
        }
        if ((*(parser->buffer).pointer == '\r') && ((parser->buffer).pointer[1] == '\n')) {
          *leading_break.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 2;
          (parser->mark).index = (parser->mark).index + 2;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 2;
          leading_break.end = leading_break.end + 1;
        }
        else if ((*(parser->buffer).pointer == '\r') || (*(parser->buffer).pointer == '\n')) {
          *leading_break.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 1;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
          leading_break.end = leading_break.end + 1;
        }
        else if ((*(parser->buffer).pointer == 0xc2) && ((parser->buffer).pointer[1] == 0x85)) {
          *leading_break.end = '\n';
          (parser->buffer).pointer = (parser->buffer).pointer + 2;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
          leading_break.end = leading_break.end + 1;
        }
        else if (((*(parser->buffer).pointer == 0xe2) && ((parser->buffer).pointer[1] == 0x80)) &&
                (((parser->buffer).pointer[2] == 0xa8 || ((parser->buffer).pointer[2] == 0xa9)))) {
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          *leading_break.end = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          pyVar13 = leading_break.end + 2;
          leading_break.end[1] = *pyVar12;
          pyVar12 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar12 + 1;
          leading_break.end = leading_break.end + 3;
          *pyVar13 = *pyVar12;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 0;
          (parser->mark).line = (parser->mark).line + 1;
          parser->unread = parser->unread - 1;
        }
        bVar7 = true;
      }
    }
    if (parser->unread == 0) {
      iVar9 = yaml_parser_update_buffer(parser,1);
joined_r0x0011465d:
      if (iVar9 == 0) goto LAB_00115a96;
    }
  }
  if (bVar7) {
    if (*trailing_breaks.pointer == '\n') {
      if (*whitespaces.pointer == '\0') {
        if ((string.start <= string.end + 5) &&
           (iVar9 = yaml_string_extend(&leading_break.pointer,&string.end,&string.start), iVar9 == 0
           )) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_00115a96;
        }
        *string.end = ' ';
        string.end = string.end + 1;
      }
      else {
        iVar9 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                                 &whitespaces.pointer,&trailing_breaks.end,&trailing_breaks.start);
        if (iVar9 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_00115a96;
        }
        trailing_breaks.end = whitespaces.pointer;
        memset(whitespaces.pointer,0,(long)trailing_breaks.start - (long)whitespaces.pointer);
      }
      leading_break.end = trailing_breaks.pointer;
      memset(trailing_breaks.pointer,0,(long)leading_break.start - (long)trailing_breaks.pointer);
    }
    else {
      iVar9 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,
                               &trailing_breaks.pointer,&leading_break.end,&leading_break.start);
      if (iVar9 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        goto LAB_00115a96;
      }
      leading_break.end = trailing_breaks.pointer;
      iVar9 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,&whitespaces.pointer
                               ,&trailing_breaks.end,&trailing_breaks.start);
      if (iVar9 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        goto LAB_00115a96;
      }
      trailing_breaks.end = whitespaces.pointer;
      leading_break.end = trailing_breaks.pointer;
      memset(trailing_breaks.pointer,0,(long)leading_break.start - (long)trailing_breaks.pointer);
      trailing_breaks.end = whitespaces.pointer;
      memset(whitespaces.pointer,0,(long)trailing_breaks.start - (long)whitespaces.pointer);
    }
    goto LAB_00112b71;
  }
  iVar9 = yaml_string_join(&leading_break.pointer,&string.end,&string.start,&stack0xffffffffffffff48
                           ,&whitespaces.end,&whitespaces.start);
  if (iVar9 == 0) goto LAB_00115800;
  whitespaces.end = pyStack_b8;
  memset(pyStack_b8,0,(long)whitespaces.start - (long)pyStack_b8);
  goto LAB_00112b71;
LAB_00115800:
  parser->error = YAML_MEMORY_ERROR;
  goto LAB_00115a96;
}

Assistant:

static int
yaml_parser_scan_flow_scalar(yaml_parser_t *parser, yaml_token_t *token,
        int single)
{
    yaml_mark_t start_mark;
    yaml_mark_t end_mark;
    yaml_string_t string = NULL_STRING;
    yaml_string_t leading_break = NULL_STRING;
    yaml_string_t trailing_breaks = NULL_STRING;
    yaml_string_t whitespaces = NULL_STRING;
    int leading_blanks;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, leading_break, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, trailing_breaks, INITIAL_STRING_SIZE)) goto error;
    if (!STRING_INIT(parser, whitespaces, INITIAL_STRING_SIZE)) goto error;

    /* Eat the left quote. */

    start_mark = parser->mark;

    SKIP(parser);

    /* Consume the content of the quoted scalar. */

    while (1)
    {
        /* Check that there are no document indicators at the beginning of the line. */

        if (!CACHE(parser, 4)) goto error;

        if (parser->mark.column == 0 &&
            ((CHECK_AT(parser->buffer, '-', 0) &&
              CHECK_AT(parser->buffer, '-', 1) &&
              CHECK_AT(parser->buffer, '-', 2)) ||
             (CHECK_AT(parser->buffer, '.', 0) &&
              CHECK_AT(parser->buffer, '.', 1) &&
              CHECK_AT(parser->buffer, '.', 2))) &&
            IS_BLANKZ_AT(parser->buffer, 3))
        {
            yaml_parser_set_scanner_error(parser, "while scanning a quoted scalar",
                    start_mark, "found unexpected document indicator");
            goto error;
        }

        /* Check for EOF. */

        if (IS_Z(parser->buffer)) {
            yaml_parser_set_scanner_error(parser, "while scanning a quoted scalar",
                    start_mark, "found unexpected end of stream");
            goto error;
        }

        /* Consume non-blank characters. */

        if (!CACHE(parser, 2)) goto error;

        leading_blanks = 0;

        while (!IS_BLANKZ(parser->buffer))
        {
            /* Check for an escaped single quote. */

            if (single && CHECK_AT(parser->buffer, '\'', 0)
                    && CHECK_AT(parser->buffer, '\'', 1))
            {
                if (!STRING_EXTEND(parser, string)) goto error;
                *(string.pointer++) = '\'';
                SKIP(parser);
                SKIP(parser);
            }

            /* Check for the right quote. */

            else if (CHECK(parser->buffer, single ? '\'' : '"'))
            {
                break;
            }

            /* Check for an escaped line break. */

            else if (!single && CHECK(parser->buffer, '\\')
                    && IS_BREAK_AT(parser->buffer, 1))
            {
                if (!CACHE(parser, 3)) goto error;
                SKIP(parser);
                SKIP_LINE(parser);
                leading_blanks = 1;
                break;
            }

            /* Check for an escape sequence. */

            else if (!single && CHECK(parser->buffer, '\\'))
            {
                size_t code_length = 0;

                if (!STRING_EXTEND(parser, string)) goto error;

                /* Check the escape character. */

                switch (parser->buffer.pointer[1])
                {
                    case '0':
                        *(string.pointer++) = '\0';
                        break;

                    case 'a':
                        *(string.pointer++) = '\x07';
                        break;

                    case 'b':
                        *(string.pointer++) = '\x08';
                        break;

                    case 't':
                    case '\t':
                        *(string.pointer++) = '\x09';
                        break;

                    case 'n':
                        *(string.pointer++) = '\x0A';
                        break;

                    case 'v':
                        *(string.pointer++) = '\x0B';
                        break;

                    case 'f':
                        *(string.pointer++) = '\x0C';
                        break;

                    case 'r':
                        *(string.pointer++) = '\x0D';
                        break;

                    case 'e':
                        *(string.pointer++) = '\x1B';
                        break;

                    case ' ':
                        *(string.pointer++) = '\x20';
                        break;

                    case '"':
                        *(string.pointer++) = '"';
                        break;

                    case '/':
                        *(string.pointer++) = '/';
                        break;

                    case '\\':
                        *(string.pointer++) = '\\';
                        break;

                    case 'N':   /* NEL (#x85) */
                        *(string.pointer++) = '\xC2';
                        *(string.pointer++) = '\x85';
                        break;

                    case '_':   /* #xA0 */
                        *(string.pointer++) = '\xC2';
                        *(string.pointer++) = '\xA0';
                        break;

                    case 'L':   /* LS (#x2028) */
                        *(string.pointer++) = '\xE2';
                        *(string.pointer++) = '\x80';
                        *(string.pointer++) = '\xA8';
                        break;

                    case 'P':   /* PS (#x2029) */
                        *(string.pointer++) = '\xE2';
                        *(string.pointer++) = '\x80';
                        *(string.pointer++) = '\xA9';
                        break;

                    case 'x':
                        code_length = 2;
                        break;

                    case 'u':
                        code_length = 4;
                        break;

                    case 'U':
                        code_length = 8;
                        break;

                    default:
                        yaml_parser_set_scanner_error(parser, "while parsing a quoted scalar",
                                start_mark, "found unknown escape character");
                        goto error;
                }

                SKIP(parser);
                SKIP(parser);

                /* Consume an arbitrary escape code. */

                if (code_length)
                {
                    unsigned int value = 0;
                    size_t k;

                    /* Scan the character value. */

                    if (!CACHE(parser, code_length)) goto error;

                    for (k = 0; k < code_length; k ++) {
                        if (!IS_HEX_AT(parser->buffer, k)) {
                            yaml_parser_set_scanner_error(parser, "while parsing a quoted scalar",
                                    start_mark, "did not find expected hexdecimal number");
                            goto error;
                        }
                        value = (value << 4) + AS_HEX_AT(parser->buffer, k);
                    }

                    /* Check the value and write the character. */

                    if ((value >= 0xD800 && value <= 0xDFFF) || value > 0x10FFFF) {
                        yaml_parser_set_scanner_error(parser, "while parsing a quoted scalar",
                                start_mark, "found invalid Unicode character escape code");
                        goto error;
                    }

                    if (value <= 0x7F) {
                        *(string.pointer++) = value;
                    }
                    else if (value <= 0x7FF) {
                        *(string.pointer++) = 0xC0 + (value >> 6);
                        *(string.pointer++) = 0x80 + (value & 0x3F);
                    }
                    else if (value <= 0xFFFF) {
                        *(string.pointer++) = 0xE0 + (value >> 12);
                        *(string.pointer++) = 0x80 + ((value >> 6) & 0x3F);
                        *(string.pointer++) = 0x80 + (value & 0x3F);
                    }
                    else {
                        *(string.pointer++) = 0xF0 + (value >> 18);
                        *(string.pointer++) = 0x80 + ((value >> 12) & 0x3F);
                        *(string.pointer++) = 0x80 + ((value >> 6) & 0x3F);
                        *(string.pointer++) = 0x80 + (value & 0x3F);
                    }

                    /* Advance the pointer. */

                    for (k = 0; k < code_length; k ++) {
                        SKIP(parser);
                    }
                }
            }

            else
            {
                /* It is a non-escaped non-blank character. */

                if (!READ(parser, string)) goto error;
            }

            if (!CACHE(parser, 2)) goto error;
        }

        /* Check if we are at the end of the scalar. */

        /* Fix for crash unitialized value crash
         * Credit for the bug and input is to OSS Fuzz
         * Credit for the fix to Alex Gaynor
         */
        if (!CACHE(parser, 1)) goto error;
        if (CHECK(parser->buffer, single ? '\'' : '"'))
            break;

        /* Consume blank characters. */

        if (!CACHE(parser, 1)) goto error;

        while (IS_BLANK(parser->buffer) || IS_BREAK(parser->buffer))
        {
            if (IS_BLANK(parser->buffer))
            {
                /* Consume a space or a tab character. */

                if (!leading_blanks) {
                    if (!READ(parser, whitespaces)) goto error;
                }
                else {
                    SKIP(parser);
                }
            }
            else
            {
                if (!CACHE(parser, 2)) goto error;

                /* Check if it is a first line break. */

                if (!leading_blanks)
                {
                    CLEAR(parser, whitespaces);
                    if (!READ_LINE(parser, leading_break)) goto error;
                    leading_blanks = 1;
                }
                else
                {
                    if (!READ_LINE(parser, trailing_breaks)) goto error;
                }
            }
            if (!CACHE(parser, 1)) goto error;
        }

        /* Join the whitespaces or fold line breaks. */

        if (leading_blanks)
        {
            /* Do we need to fold line breaks? */

            if (leading_break.start[0] == '\n') {
                if (trailing_breaks.start[0] == '\0') {
                    if (!STRING_EXTEND(parser, string)) goto error;
                    *(string.pointer++) = ' ';
                }
                else {
                    if (!JOIN(parser, string, trailing_breaks)) goto error;
                    CLEAR(parser, trailing_breaks);
                }
                CLEAR(parser, leading_break);
            }
            else {
                if (!JOIN(parser, string, leading_break)) goto error;
                if (!JOIN(parser, string, trailing_breaks)) goto error;
                CLEAR(parser, leading_break);
                CLEAR(parser, trailing_breaks);
            }
        }
        else
        {
            if (!JOIN(parser, string, whitespaces)) goto error;
            CLEAR(parser, whitespaces);
        }
    }

    /* Eat the right quote. */

    SKIP(parser);

    end_mark = parser->mark;

    /* Create a token. */

    SCALAR_TOKEN_INIT(*token, string.start, string.pointer-string.start,
            single ? YAML_SINGLE_QUOTED_SCALAR_STYLE : YAML_DOUBLE_QUOTED_SCALAR_STYLE,
            start_mark, end_mark);

    STRING_DEL(parser, leading_break);
    STRING_DEL(parser, trailing_breaks);
    STRING_DEL(parser, whitespaces);

    return 1;

error:
    STRING_DEL(parser, string);
    STRING_DEL(parser, leading_break);
    STRING_DEL(parser, trailing_breaks);
    STRING_DEL(parser, whitespaces);

    return 0;
}